

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_select_image_section(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  fitsfile *in_RCX;
  fitsfile *in_RDX;
  fitsfile *in_RSI;
  long *in_RDI;
  int hdunum;
  int ii;
  fitsfile *newptr;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int *in_stack_000002f8;
  char *in_stack_00000300;
  fitsfile *in_stack_00000308;
  fitsfile *in_stack_00000310;
  int *in_stack_00000878;
  char *in_stack_00000880;
  fitsfile **in_stack_00000888;
  int local_38;
  int local_34;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar1 = ffinit(in_stack_00000888,in_stack_00000880,in_stack_00000878);
  if (iVar1 < 1) {
    ffghdn((fitsfile *)*in_RDI,&local_38);
    if (*(int *)(*(long *)(*in_RDI + 8) + 0x1c) == 0) {
      for (local_34 = 1; local_34 < local_38; local_34 = local_34 + 1) {
        ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
        iVar1 = ffcopy(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
        if (0 < iVar1) {
          ffclos(in_RCX,in_stack_ffffffffffffffd0);
          return in_RCX->HDUposition;
        }
      }
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
    }
    iVar1 = fits_copy_image_section
                      (in_stack_00000310,in_stack_00000308,in_stack_00000300,in_stack_000002f8);
    if (iVar1 < 1) {
      local_34 = local_38;
      if (*(int *)(*(long *)(*in_RDI + 8) + 0x1c) == 0) {
        while( true ) {
          local_34 = local_34 + 1;
          iVar1 = ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
          if (0 < iVar1) break;
          ffcopy(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
        }
        if (in_RCX->HDUposition == 0x6b) {
          in_RCX->HDUposition = 0;
        }
        else if (0 < in_RCX->HDUposition) {
          ffclos(in_RCX,in_stack_ffffffffffffffd0);
          return in_RCX->HDUposition;
        }
      }
      else {
        local_34 = local_38 + 1;
      }
      ffclos(in_RCX,in_stack_ffffffffffffffd0);
      *in_RDI = (long)in_stack_ffffffffffffffd0;
      if (local_34 + -1 == local_38) {
        iVar1 = ffrdef(in_stack_000000d8,in_stack_000000d0);
        if (0 < iVar1) {
          ffclos(in_RCX,in_stack_ffffffffffffffd0);
          return in_RCX->HDUposition;
        }
      }
      else {
        ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      }
      local_4 = in_RCX->HDUposition;
    }
    else {
      ffclos(in_RCX,in_stack_ffffffffffffffd0);
      local_4 = in_RCX->HDUposition;
    }
  }
  else {
    ffpmsg((char *)0x1156bd);
    ffpmsg((char *)0x1156c7);
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int fits_select_image_section(
           fitsfile **fptr,  /* IO - pointer to input image; on output it  */
                             /*      points to the new subimage */
           char *outfile,    /* I - name for output file        */
           char *expr,       /* I - Image section expression    */
           int *status)
{
  /*
     copies an image section from the input file to a new output file.
     Any HDUs preceding or following the image are also copied to the
     output file.
  */

    fitsfile *newptr;
    int ii, hdunum;

    /* create new empty file to hold the image section */
    if (ffinit(&newptr, outfile, status) > 0)
    {
        ffpmsg(
         "failed to create output file for image section:");
        ffpmsg(outfile);
        return(*status);
    }

    fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

    /* copy all preceding extensions to the output file, if 'only_one' flag not set */
    if (!(((*fptr)->Fptr)->only_one)) {
      for (ii = 1; ii < hdunum; ii++)
      {
        fits_movabs_hdu(*fptr, ii, NULL, status);
        if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
        {
            ffclos(newptr, status);
            return(*status);
        }
      }

      /* move back to the original HDU position */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    if (fits_copy_image_section(*fptr, newptr, expr, status) > 0)
    {
        ffclos(newptr, status);
        return(*status);
    }

    /* copy any remaining HDUs to the output file, if 'only_one' flag not set */

    if (!(((*fptr)->Fptr)->only_one)) {
      for (ii = hdunum + 1; 1; ii++)
      {
        if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

        fits_copy_hdu(*fptr, newptr, 0, status);
      }

      if (*status == END_OF_FILE)   
        *status = 0;              /* got the expected EOF error; reset = 0  */
      else if (*status > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }
    } else {
      ii = hdunum + 1;  /* this value of ii is required below */
    }

    /* close the original file and return ptr to the new image */
    ffclos(*fptr, status);

    *fptr = newptr; /* reset the pointer to the new table */

    /* move back to the image subsection */
    if (ii - 1 != hdunum)
        fits_movabs_hdu(*fptr, hdunum, NULL, status);
    else
    {
        /* may have to reset BSCALE and BZERO pixel scaling, */
        /* since the keywords were previously turned off */

        if (ffrdef(*fptr, status) > 0)  
        {
            ffclos(*fptr, status);
            return(*status);
        }

    }

    return(*status);
}